

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

bool __thiscall libcellml::Variable::doEquals(Variable *this,EntityPtr *other)

{
  element_type *peVar1;
  EntityImpl *pEVar2;
  long lVar3;
  size_t sVar4;
  Entity *this_00;
  bool bVar5;
  int iVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  bool bVar8;
  long *local_80;
  size_t local_78;
  long local_70 [2];
  EntityPtr local_60;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  bVar5 = NamedEntity::doEquals(&this->super_NamedEntity,other);
  if (!bVar5) {
    return false;
  }
  peVar1 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = __dynamic_cast(peVar1,&Entity::typeinfo,&typeinfo,0);
  }
  if (lVar7 == 0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar7 = 0;
  }
  else {
    this_01 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              ._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
  }
  if (lVar7 == 0) {
LAB_0029280c:
    bVar5 = false;
  }
  else {
    pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    local_80 = local_70;
    lVar3 = *(long *)(*(long *)(lVar7 + 8) + 0xd0);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,lVar3,*(long *)(*(long *)(lVar7 + 8) + 0xd8) + lVar3);
    sVar4 = *(size_t *)((long)&pEVar2[6].mId.field_2 + 8);
    if ((sVar4 != local_78) ||
       ((sVar4 != 0 &&
        (iVar6 = bcmp((void *)pEVar2[6].mId.field_2._M_allocated_capacity,local_80,sVar4),
        iVar6 != 0)))) goto LAB_0029280c;
    pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    local_50 = local_40;
    lVar3 = *(long *)(*(long *)(lVar7 + 8) + 0xf0);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,lVar3,*(long *)(*(long *)(lVar7 + 8) + 0xf8) + lVar3);
    sVar4 = *(size_t *)((long)&pEVar2[7].mId.field_2 + 8);
    if (sVar4 == local_48) {
      bVar5 = true;
      if (sVar4 == 0) {
        bVar8 = true;
      }
      else {
        iVar6 = bcmp((void *)pEVar2[7].mId.field_2._M_allocated_capacity,local_50,sVar4);
        bVar8 = iVar6 == 0;
      }
      goto LAB_00292811;
    }
    bVar5 = true;
  }
  bVar8 = false;
LAB_00292811:
  if ((bVar5 != false) && (local_50 != local_40)) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((lVar7 != 0) && (local_80 != local_70)) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (bVar8) {
    this_00 = (Entity *)
              (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[8].mId.field_2.
              _M_allocated_capacity;
    if (this_00 == (Entity *)0x0) {
      lVar3 = *(long *)(*(long *)(lVar7 + 8) + 0x110);
      this_02._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(lVar7 + 8) + 0x118);
      if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
        }
      }
      bVar5 = lVar3 == 0;
    }
    else {
      local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(*(long *)(lVar7 + 8) + 0x110);
      local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(lVar7 + 8) + 0x118);
      if (local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar5 = Entity::equals(this_00,&local_60);
      this_02._M_pi =
           local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
    if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    }
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (!bVar8) {
    return false;
  }
  return bVar5;
}

Assistant:

bool Variable::doEquals(const EntityPtr &other) const
{
    if (NamedEntity::doEquals(other)) {
        auto variable = std::dynamic_pointer_cast<libcellml::Variable>(other);
        if ((variable != nullptr)
            && pFunc()->mInitialValue == variable->initialValue()
            && pFunc()->mInterfaceType == variable->interfaceType()) {
            if (pFunc()->mUnits != nullptr) {
                return pFunc()->mUnits->equals(variable->units());
            }

            return variable->units() == nullptr;
        }
    }
    return false;
}